

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_negotiate(telnet_t *telnet,uchar cmd,int telopt)

{
  undefined4 uVar1;
  char him;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  size_t size;
  undefined1 uVar5;
  ulong uVar6;
  uchar bytes [3];
  undefined4 local_17;
  undefined1 local_13;
  undefined2 local_12;
  
  uVar1 = local_17;
  if (0x1ff < telopt) {
    _error(telnet,0x546,"telnet_negotiate",TELNET_EBADVAL,0,
           "supplied telopt %d for negotiation is greater than 511",telopt);
    return;
  }
  uVar5 = (undefined1)telopt;
  if ((telnet->flags & 1) == 0) {
    if ((ulong)telnet->q_cnt == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      uVar6 = 0;
      do {
        if (telnet->q[uVar6].telopt == telopt) {
          uVar2 = (ulong)telnet->q[uVar6].state << 0x20;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (telnet->q_cnt != uVar6);
    }
    uVar4 = (uint)(uVar2 >> 0x20);
    bVar3 = (byte)(uVar2 >> 0x20);
    switch(cmd) {
    case 0xfb:
      if ((uVar4 & 0xf) == 5) {
        him = (char)(uVar2 >> 0x24);
        bVar3 = 3;
LAB_00102bd3:
        _set_rfc1143(telnet,telopt,bVar3,him);
        return;
      }
      if ((uVar4 & 0xf) == 2) {
        him = (char)(uVar2 >> 0x24);
        bVar3 = 4;
        goto LAB_00102bd3;
      }
      if ((uVar2 & 0xf00000000) != 0) {
        return;
      }
      _set_rfc1143(telnet,telopt,'\x03',(char)(uVar2 >> 0x24));
      if (0xff < telopt) {
        local_17 = 0xfbfffaff;
LAB_00102b45:
        local_12 = 0xf0ff;
        size = 7;
        local_13 = uVar5;
        goto LAB_001029df;
      }
      local_17 = CONCAT22(local_17._2_2_,0xfbff);
      break;
    case 0xfc:
      uVar4 = uVar4 & 0xf;
      if (uVar4 == 4) {
        him = (char)(uVar2 >> 0x24);
        bVar3 = 2;
        goto LAB_00102bd3;
      }
      if (uVar4 == 3) {
        him = (char)(uVar2 >> 0x24);
        bVar3 = 5;
        goto LAB_00102bd3;
      }
      if (uVar4 != 1) {
        return;
      }
      _set_rfc1143(telnet,telopt,'\x02',(char)(uVar2 >> 0x24));
      if (0xff < telopt) {
        local_17 = 0xfcfffaff;
        goto LAB_00102b45;
      }
      local_17 = CONCAT22(local_17._2_2_,0xfcff);
      break;
    case 0xfd:
      if (uVar2 >> 0x24 == 5) {
        bVar3 = bVar3 & 0xf;
        him = '\x03';
        goto LAB_00102bd3;
      }
      if (uVar4 >> 4 == 2) {
        bVar3 = bVar3 & 0xf;
        him = '\x04';
        goto LAB_00102bd3;
      }
      if (uVar4 >> 4 != 0) {
        return;
      }
      _set_rfc1143(telnet,telopt,bVar3 & 0xf,'\x03');
      if (0xff < telopt) {
        local_17 = 0xfdfffaff;
        goto LAB_00102b45;
      }
      local_17 = CONCAT22(local_17._2_2_,0xfdff);
      break;
    case 0xfe:
      if (uVar2 >> 0x24 == 4) {
        bVar3 = bVar3 & 0xf;
        him = '\x02';
        goto LAB_00102bd3;
      }
      if (uVar4 >> 4 == 3) {
        bVar3 = bVar3 & 0xf;
        him = '\x05';
        goto LAB_00102bd3;
      }
      if (uVar4 >> 4 != 1) {
        return;
      }
      _set_rfc1143(telnet,telopt,bVar3 & 0xf,'\x02');
      if (0xff < telopt) {
        local_17 = 0xfefffaff;
        goto LAB_00102b45;
      }
      local_17 = CONCAT22(local_17._2_2_,0xfeff);
      break;
    default:
      goto switchD_00102a1b_default;
    }
    local_17._0_3_ = CONCAT12(uVar5,(undefined2)local_17);
    size = 3;
  }
  else {
    local_17._0_2_ = CONCAT11(cmd,0xff);
    local_17._3_1_ = SUB41(uVar1,3);
    local_17._0_3_ = CONCAT12(uVar5,(undefined2)local_17);
    size = 3;
  }
LAB_001029df:
  _send(telnet,(char *)&local_17,size);
switchD_00102a1b_default:
  return;
}

Assistant:

void telnet_negotiate(telnet_t *telnet, unsigned char cmd,
		int telopt) {
	telnet_rfc1143_t q;

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for negotiation is greater than 511", telopt);
		return;
	}

	/* if we're in proxy mode, just send it now */
	if (telnet->flags & TELNET_FLAG_PROXY) {
		unsigned char bytes[3];
		bytes[0] = TELNET_IAC;
		bytes[1] = cmd;
		bytes[2] = (unsigned char)telopt;
		_sendu(telnet, bytes, 3);
		return;
	}

	/* get current option states */
	q = _get_rfc1143(telnet, telopt);

	switch (cmd) {
	/* advertise willingess to support an option */
	case TELNET_WILL:
		switch (Q_US(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			SEND_NEGOTIATION(telnet, TELNET_WILL, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_WANTNO_OP, Q_HIM(q));
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			break;
		}
		break;

	/* force turn-off of locally enabled option */
	case TELNET_WONT:
		switch (Q_US(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			SEND_NEGOTIATION(telnet, TELNET_WONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_WANTYES_OP, Q_HIM(q));
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			break;
		}
		break;

	/* ask remote end to enable an option */
	case TELNET_DO:
		switch (Q_HIM(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			SEND_NEGOTIATION(telnet, TELNET_DO, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO_OP);
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			break;
		}
		break;

	/* demand remote end disable an option */
	case TELNET_DONT:
		switch (Q_HIM(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			SEND_NEGOTIATION(telnet, TELNET_DONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES_OP);
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			break;
		}
		break;
	}
}